

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O3

void aba_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  solver_state_a s;
  int local_120 [4];
  long local_110;
  long local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  setup_simple_state_a(&two_dof_robot_a,local_120);
  if (0 < local_120[0]) {
    lVar1 = 0x48;
    lVar5 = 0;
    lVar3 = 0;
    lVar2 = 0;
    do {
      lVar4 = _two_dof_robot_c + lVar1 + -0x28;
      kca_fpk(lVar4,local_110 + lVar2);
      ga_pose_compose(local_110 + lVar2,_two_dof_robot_c + lVar1 + -0x48,local_108 + lVar2);
      kca_fvk(lVar4,local_f8 + lVar2);
      ga_twist_tf_ref_to_tgt(local_108 + lVar2,local_e8 + lVar2,local_f0 + lVar2);
      lVar7 = lVar2 + 0x20;
      ga_twist_accumulate(local_f0 + lVar2,local_f8 + lVar2,local_e8 + lVar7);
      kca_inertial_acceleration(lVar4,local_e8 + lVar7,lVar2 + local_d8);
      lVar2 = lVar3 + 0x18;
      ma_rbi_to_abi(_two_dof_robot_c + lVar1,local_b0 + lVar2);
      ma_rbi_map_twist_to_momentum(_two_dof_robot_c + lVar1,local_e8 + lVar7,local_98 + lVar3);
      ma_momentum_derive(local_e8 + lVar7,local_98 + lVar3,local_90 + lVar2);
      ma_wrench_invert(lVar3 + local_50,local_48 + lVar2);
      lVar4 = (long)local_120[0];
      lVar5 = lVar5 + 1;
      lVar1 = lVar1 + 0x60;
      lVar3 = lVar2;
      lVar2 = lVar7;
    } while (lVar5 < lVar4);
    if (0 < local_120[0]) {
      uVar6 = lVar4 + 1;
      lVar1 = lVar4 * 0x20;
      lVar2 = lVar4 * 0x60 + -0x40;
      lVar3 = lVar4 * 0x18;
      do {
        lVar1 = lVar1 + -0x20;
        lVar7 = _two_dof_robot_c + lVar2;
        lVar5 = lVar3 + -0x18;
        kca_project_inertia(lVar7,local_b0 + lVar3,local_a8 + lVar5);
        ma_abi_tf_tgt_to_ref(local_108 + lVar1,local_a8 + lVar5,local_a0 + lVar3);
        ma_abi_add(local_b0 + lVar5,local_a0 + lVar3,local_b0 + lVar5);
        ma_abi_map_acc_twist_to_wrench(local_b0 + lVar3,local_d8 + lVar1,local_88 + lVar5);
        ma_wrench_add(local_88 + lVar5,local_90 + lVar3,local_88 + lVar5);
        kca_project_wrench(lVar7,local_b0 + lVar3,local_88 + lVar5,local_80 + lVar5);
        ma_wrench_tf_tgt_to_ref(local_108 + lVar1,local_80 + lVar5,local_78 + lVar5);
        ma_wrench_add(local_90 + lVar5,local_78 + lVar5,local_90 + lVar5);
        kca_ffd(lVar7,local_b0 + lVar3,local_58 + lVar5);
        kca_project_wrench(lVar7,local_b0 + lVar3,local_68 + lVar3,local_60 + lVar5);
        ma_wrench_add(local_60 + lVar5,local_58 + lVar5,local_60 + lVar5);
        ma_wrench_tf_tgt_to_ref(local_108 + lVar1,local_60 + lVar5,local_68 + lVar5);
        kca_project_wrench(lVar7,local_b0 + lVar3,lVar3 + local_48,local_40 + lVar5);
        ma_wrench_tf_tgt_to_ref(local_108 + lVar1,local_40 + lVar5,local_38 + lVar5);
        ma_wrench_add(local_48 + lVar5,local_38 + lVar5,local_48 + lVar5);
        uVar6 = uVar6 - 1;
        lVar2 = lVar2 + -0x60;
        lVar3 = lVar5;
      } while (1 < uVar6);
    }
  }
  ma_abi_log(local_b0);
  ma_wrench_log(local_90);
  ma_wrench_log(local_68);
  ma_wrench_log(local_48);
  lVar3 = (long)local_120[0];
  if (0 < lVar3) {
    lVar2 = 0x18;
    lVar7 = 0x20;
    lVar1 = 0;
    lVar5 = 0;
    do {
      lVar3 = _two_dof_robot_c + lVar7;
      ga_acc_twist_tf_ref_to_tgt(local_108 + lVar1,local_b8 + lVar1,local_c8 + lVar1);
      ga_acc_twist_accumulate(local_c8 + lVar1,local_d8 + lVar1,local_c0 + lVar1);
      ma_abi_map_acc_twist_to_wrench(local_b0 + lVar2,local_c0 + lVar1,local_70 + lVar2 + -0x18);
      kca_ifk(lVar3,local_70 + lVar2 + -0x18);
      kca_ifk(lVar3,local_68 + lVar2);
      kca_ifk(lVar3,local_48 + lVar2);
      kca_fak(lVar3,local_e0 + lVar1);
      ga_acc_twist_add(local_e0 + lVar1,local_d8 + lVar1,local_d0 + lVar1);
      lVar4 = local_c8 + lVar1;
      lVar3 = local_d0 + lVar1;
      lVar1 = lVar1 + 0x20;
      ga_acc_twist_accumulate(lVar4,lVar3,local_b8 + lVar1);
      lVar3 = (long)local_120[0];
      lVar5 = lVar5 + 1;
      lVar2 = lVar2 + 0x18;
      lVar7 = lVar7 + 0x60;
    } while (lVar5 < lVar3);
  }
  ga_acc_twist_log(lVar3 * 0x20 + local_b8);
  return;
}

Assistant:

void aba_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        ma_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // p_i = M_i Xd_i
        ma_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        ma_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        ma_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i]);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kca_project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        ma_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        ma_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        ma_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kca_project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1]);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1]);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        ma_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1]);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kca_ffd(joint, &s.m_art[i], &s.f_ff_jnt[i - 1]);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1]);

        // F_{tau,i}^a += F_{tau,i}'
        ma_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1]);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1]);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1]);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1]);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        ma_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1]);
    }

    ma_abi_log(&s.m_art[0]);
    ma_wrench_log(&s.f_bias_art[0]);
    ma_wrench_log(&s.f_ff_art[0]);
    ma_wrench_log(&s.f_ext_art[0]);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i} = S^T F_{bias,i}
        kca_ifk(joint, &s.f_bias_nact[i - 1]);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kca_ifk(joint, &s.f_ff_art[i]);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kca_ifk(joint, &s.f_ext_art[i]);


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}